

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpmAbc.c
# Opt level: O3

int Mpm_ManNodeIfToGia_rec
              (Gia_Man_t *pNew,Mpm_Man_t *pMan,Mig_Obj_t *pObj,Vec_Ptr_t *vVisited,int fHash)

{
  Mig_Fan_t MVar1;
  long lVar2;
  int iVar3;
  Mpm_Cut_t *pMVar4;
  void **ppvVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  Mig_Obj_t *pMVar10;
  Mig_Obj_t *pMVar11;
  
  if (fHash != 0) {
    __assert_fail("fHash == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/mpm/mpmAbc.c"
                  ,0x82,
                  "int Mpm_ManNodeIfToGia_rec(Gia_Man_t *, Mpm_Man_t *, Mig_Obj_t *, Vec_Ptr_t *, int)"
                 );
  }
  pMVar4 = Mpm_ObjCutBestP(pMan,(Mig_Obj_t *)(ulong)(uint)pObj->pFans[3]);
  iVar3 = pMVar4->hNext;
  if (iVar3 == 0) {
    uVar7 = vVisited->nSize;
    if (uVar7 == vVisited->nCap) {
      if ((int)uVar7 < 0x10) {
        if (vVisited->pArray == (void **)0x0) {
          ppvVar5 = (void **)malloc(0x80);
        }
        else {
          ppvVar5 = (void **)realloc(vVisited->pArray,0x80);
        }
        vVisited->pArray = ppvVar5;
        vVisited->nCap = 0x10;
      }
      else {
        if (vVisited->pArray == (void **)0x0) {
          ppvVar5 = (void **)malloc((ulong)uVar7 << 4);
        }
        else {
          ppvVar5 = (void **)realloc(vVisited->pArray,(ulong)uVar7 << 4);
        }
        vVisited->pArray = ppvVar5;
        vVisited->nCap = uVar7 * 2;
      }
    }
    else {
      ppvVar5 = vVisited->pArray;
    }
    iVar3 = vVisited->nSize;
    vVisited->nSize = iVar3 + 1;
    ppvVar5[iVar3] = pMVar4;
    pMVar4->hNext = -1;
    if ((((uint)pObj->pFans[1] < 0xfffffffe) || (0xfffffffd < (uint)pObj->pFans[2])) ||
       (iVar3 = -1, (uint)pObj->pFans[0] < 0xfffffffe)) {
      uVar7 = 0;
      pMVar11 = pObj;
      do {
        MVar1 = pMVar11->pFans[0];
        if ((uint)MVar1 >> 1 < 0x7fffffff) {
          uVar6 = (uint)pMVar11->pFans[3] >> 1;
          uVar8 = (uint)MVar1 >> 1;
          if (uVar6 <= uVar8) goto LAB_008d16f5;
          lVar2 = *(long *)((long)pMVar11 + (-0x10 - (ulong)((uVar6 & 0xfff) << 4)));
          if (*(int *)(lVar2 + 8) <= (int)uVar8) goto LAB_008d16b7;
          if (*(int *)(lVar2 + 0x1c) <= (int)((uint)MVar1 >> 0xd)) goto LAB_008d16d6;
          pMVar10 = (Mig_Obj_t *)
                    ((ulong)((uVar8 & 0xfff) << 4) +
                    *(long *)(*(long *)(lVar2 + 0x20) + (ulong)((uint)MVar1 >> 0xd) * 8));
        }
        else {
          pMVar10 = (Mig_Obj_t *)0x0;
        }
        uVar6 = Mpm_ManNodeIfToGia_rec(pNew,pMan,pMVar10,vVisited,0);
        if (uVar6 != 0xffffffff) {
          MVar1 = pMVar11->pFans[1];
          if ((uint)MVar1 >> 1 < 0x7fffffff) {
            uVar8 = (uint)pMVar11->pFans[3] >> 1;
            uVar9 = (uint)MVar1 >> 1;
            if (uVar8 <= uVar9) goto LAB_008d16f5;
            lVar2 = *(long *)((long)pMVar11 + (-0x10 - (ulong)((uVar8 & 0xfff) << 4)));
            if (*(int *)(lVar2 + 8) <= (int)uVar9) goto LAB_008d16b7;
            if (*(int *)(lVar2 + 0x1c) <= (int)((uint)MVar1 >> 0xd)) goto LAB_008d16d6;
            pMVar10 = (Mig_Obj_t *)
                      ((ulong)((uVar9 & 0xfff) << 4) +
                      *(long *)(*(long *)(lVar2 + 0x20) + (ulong)((uint)MVar1 >> 0xd) * 8));
          }
          else {
            pMVar10 = (Mig_Obj_t *)0x0;
          }
          uVar8 = Mpm_ManNodeIfToGia_rec(pNew,pMan,pMVar10,vVisited,0);
          if (uVar8 != 0xffffffff) {
            if (((uint)pMVar11->pFans[1] < 0xfffffffe) &&
               (MVar1 = pMVar11->pFans[2], (uint)MVar1 >> 1 < 0x7fffffff)) {
              uVar7 = (uint)pMVar11->pFans[3] >> 1;
              uVar9 = (uint)MVar1 >> 1;
              if (uVar7 <= uVar9) {
LAB_008d16f5:
                __assert_fail("i < 3 && Mig_FanId(p, i) < Mig_ObjId(p)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/mpm/mpmMig.h"
                              ,0xaa,"int Mig_ObjFaninId(Mig_Obj_t *, int)");
              }
              lVar2 = *(long *)((long)pMVar11 + (-0x10 - (ulong)((uVar7 & 0xfff) << 4)));
              if (*(int *)(lVar2 + 8) <= (int)uVar9) goto LAB_008d16b7;
              if (*(int *)(lVar2 + 0x1c) <= (int)((uint)MVar1 >> 0xd)) goto LAB_008d16d6;
              uVar9 = Mpm_ManNodeIfToGia_rec
                                (pNew,pMan,
                                 (Mig_Obj_t *)
                                 ((ulong)((uVar9 & 0xfff) << 4) +
                                 *(long *)(*(long *)(lVar2 + 0x20) + (ulong)((uint)MVar1 >> 0xd) * 8
                                          )),vVisited,0);
              uVar7 = 0xffffffff;
              if (uVar9 == 0xffffffff) goto LAB_008d1593;
              if ((int)uVar9 < 0) goto LAB_008d1752;
              uVar7 = (uint)pMVar11->pFans[2] & 1 ^ uVar9;
            }
            if (((int)uVar6 < 0) || ((int)uVar8 < 0)) {
LAB_008d1752:
              __assert_fail("Lit >= 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                            ,0x132,"int Abc_LitNotCond(int, int)");
            }
            uVar6 = (uint)pMVar11->pFans[0] & 1 ^ uVar6;
            MVar1 = pMVar11->pFans[1];
            uVar8 = (uint)MVar1 & 1 ^ uVar8;
            if ((uint)MVar1 < 0xfffffffe) {
              if ((uint)pMVar11->pFans[2] < 0xfffffffe) {
                uVar7 = Gia_ManAppendMux(pNew,uVar7,uVar8,uVar6);
                goto LAB_008d1681;
              }
              if ((uint)MVar1 >> 1 < (uint)pMVar11->pFans[0] >> 1) {
                uVar7 = Gia_ManAppendXor(pNew,uVar6,uVar8);
                goto LAB_008d1681;
              }
            }
            uVar7 = Gia_ManAppendAnd(pNew,uVar6,uVar8);
LAB_008d1681:
            if ((((uint)pObj->pFans[3] ^ (uint)pMVar11->pFans[3]) & 1) != 0) {
              if ((int)uVar7 < 0) {
                __assert_fail("Lit >= 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                              ,0x131,"int Abc_LitNot(int)");
              }
              uVar7 = uVar7 ^ 1;
            }
            pMVar4->hNext = uVar7;
            return uVar7;
          }
        }
LAB_008d1593:
        uVar6 = (uint)pMVar11->pFans[3] >> 1;
        lVar2 = *(long *)((long)pMVar11 + (-0x10 - (ulong)((uVar6 & 0xfff) << 4)));
        if (*(int *)(lVar2 + 0x7c) == 0) break;
        if (*(int *)(lVar2 + 0x7c) <= (int)uVar6) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        uVar6 = *(uint *)(*(long *)(lVar2 + 0x80) + (ulong)uVar6 * 4);
        if (uVar6 == 0) break;
        if (((int)uVar6 < 0) || (*(int *)(lVar2 + 8) <= (int)uVar6)) {
LAB_008d16b7:
          __assert_fail("v >= 0 && v < p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/mpm/mpmMig.h"
                        ,0x74,"Mig_Obj_t *Mig_ManObj(Mig_Man_t *, int)");
        }
        if (*(int *)(lVar2 + 0x1c) <= (int)(uVar6 >> 0xc)) {
LAB_008d16d6:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        lVar2 = *(long *)(*(long *)(lVar2 + 0x20) + (ulong)(uVar6 >> 0xc) * 8);
        pMVar11 = (Mig_Obj_t *)((ulong)((uVar6 & 0xfff) << 4) + lVar2);
      } while (lVar2 != 0);
      iVar3 = pMVar4->hNext;
    }
  }
  return iVar3;
}

Assistant:

int Mpm_ManNodeIfToGia_rec( Gia_Man_t * pNew, Mpm_Man_t * pMan, Mig_Obj_t * pObj, Vec_Ptr_t * vVisited, int fHash )
{
    Mig_Obj_t * pTemp;
    Mpm_Cut_t * pCut;
    int iFunc, iFunc0, iFunc1, iFunc2 = 0;
    assert( fHash == 0 );
    // get the best cut
    pCut = Mpm_ObjCutBestP( pMan, pObj );
    // if the cut is visited, return the result
    if ( Mpm_CutDataInt(pCut) )
        return Mpm_CutDataInt(pCut);
    // mark the node as visited
    Vec_PtrPush( vVisited, pCut );
    // insert the worst case
    Mpm_CutSetDataInt( pCut, ~0 );
    // skip in case of primary input
    if ( Mig_ObjIsCi(pObj) )
        return Mpm_CutDataInt(pCut);
    // compute the functions of the children
    for ( pTemp = pObj; pTemp; pTemp = Mig_ObjSibl(pTemp) )
    {
        iFunc0 = Mpm_ManNodeIfToGia_rec( pNew, pMan, Mig_ObjFanin0(pTemp), vVisited, fHash );
        if ( iFunc0 == ~0 )
            continue;
        iFunc1 = Mpm_ManNodeIfToGia_rec( pNew, pMan, Mig_ObjFanin1(pTemp), vVisited, fHash );
        if ( iFunc1 == ~0 )
            continue;
        if ( Mig_ObjIsNode3(pTemp) )
        {
            iFunc2 = Mpm_ManNodeIfToGia_rec( pNew, pMan, Mig_ObjFanin2(pTemp), vVisited, fHash );
            if ( iFunc2 == ~0 )
                continue;
            iFunc2 = Abc_LitNotCond(iFunc2, Mig_ObjFaninC2(pTemp));
        }
        iFunc0 = Abc_LitNotCond(iFunc0, Mig_ObjFaninC0(pTemp));
        iFunc1 = Abc_LitNotCond(iFunc1, Mig_ObjFaninC1(pTemp));
        // both branches are solved
        if ( fHash )
        {
            if ( Mig_ObjIsMux(pTemp) )
                iFunc = Gia_ManHashMux( pNew, iFunc2, iFunc1, iFunc0 );
            else if ( Mig_ObjIsXor(pTemp) )
                iFunc = Gia_ManHashXor( pNew, iFunc0, iFunc1 );
            else 
                iFunc = Gia_ManHashAnd( pNew, iFunc0, iFunc1 ); 
        }
        else
        {
            if ( Mig_ObjIsMux(pTemp) )
                iFunc = Gia_ManAppendMux( pNew, iFunc2, iFunc1, iFunc0 );
            else if ( Mig_ObjIsXor(pTemp) )
                iFunc = Gia_ManAppendXor( pNew, iFunc0, iFunc1 );
            else 
                iFunc = Gia_ManAppendAnd( pNew, iFunc0, iFunc1 ); 
        }
        if ( Mig_ObjPhase(pTemp) != Mig_ObjPhase(pObj) )
            iFunc = Abc_LitNot(iFunc);
        Mpm_CutSetDataInt( pCut, iFunc );
        break;
    }
    return Mpm_CutDataInt(pCut);
}